

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_choice_child
                 (lysc_ctx *ctx,lysp_node *child_p,lysc_node *node,ly_set *child_set)

{
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *pnode;
  long lVar3;
  ushort uVar4;
  
  if (child_p->nodetype == 0x80) {
    LVar2 = lys_compile_node(ctx,child_p,node,0,child_set);
    return LVar2;
  }
  plVar1 = child_p->next;
  pnode = (lysp_node *)calloc(1,0x50);
  if (pnode == (lysp_node *)0x0) {
    LVar2 = LY_EMEM;
    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lys_compile_node_choice_child");
  }
  else {
    pnode->nodetype = 0x80;
    LVar2 = lydict_dup(ctx->ctx,child_p->name,&pnode->name);
    if (LVar2 == LY_SUCCESS) {
      pnode[1].parent = child_p;
      child_p->next = (lysp_node *)0x0;
      LVar2 = lys_compile_node(ctx,pnode,node,0,child_set);
      if (LVar2 == LY_SUCCESS) {
        lVar3._0_2_ = node[1].nodetype;
        lVar3._2_2_ = node[1].flags;
        lVar3._4_1_ = node[1].hash[0];
        lVar3._5_1_ = node[1].hash[1];
        lVar3._6_1_ = node[1].hash[2];
        lVar3._7_1_ = node[1].hash[3];
        if (lVar3 == 0) {
          LVar2 = LY_SUCCESS;
        }
        else {
          while (*(char **)(lVar3 + 0x28) != pnode->name) {
            lVar3 = *(long *)(lVar3 + 0x18);
            if (lVar3 == 0) {
              __assert_fail("cs_c",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                            ,0xe51,
                            "LY_ERR lys_compile_node_choice_child(struct lysc_ctx *, struct lysp_node *, struct lysc_node *, struct ly_set *)"
                           );
            }
          }
          LVar2 = LY_SUCCESS;
          if ((ctx->ctx->flags & 0x40) != 0) {
            if (*(lysp_node **)(lVar3 + 0x48) != pnode) {
              __assert_fail("cs_c->priv == cs_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                            ,0xe58,
                            "LY_ERR lys_compile_node_choice_child(struct lysc_ctx *, struct lysp_node *, struct lysc_node *, struct ly_set *)"
                           );
            }
            *(undefined8 *)(lVar3 + 0x48) = 0;
          }
          if (*(long *)(lVar3 + 0x50) != 0) {
            uVar4 = *(ushort *)(lVar3 + 2) & 0xffe3;
            *(ushort *)(lVar3 + 2) = uVar4;
            *(ushort *)(lVar3 + 2) = *(ushort *)(*(long *)(lVar3 + 0x50) + 2) & 0x1c | uVar4;
          }
        }
      }
    }
    pnode[1].parent = (lysp_node *)0x0;
    lysp_node_free(&ctx->free_ctx,pnode);
    child_p->next = plVar1;
  }
  return LVar2;
}

Assistant:

LY_ERR
lys_compile_node_choice_child(struct lysc_ctx *ctx, struct lysp_node *child_p, struct lysc_node *node,
        struct ly_set *child_set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p_next = child_p->next;
    struct lysp_node_case *cs_p;
    struct lysc_node_case *cs_c;

    if (child_p->nodetype == LYS_CASE) {
        /* standard case under choice */
        ret = lys_compile_node(ctx, child_p, node, 0, child_set);
    } else {
        /* we need the implicit case first, so create a fake parsed (shorthand) case */
        cs_p = calloc(1, sizeof *cs_p);
        LY_CHECK_ERR_RET(!cs_p, LOGMEM(ctx->ctx), LY_EMEM);
        cs_p->nodetype = LYS_CASE;
        DUP_STRING_GOTO(ctx->ctx, child_p->name, cs_p->name, ret, revert_sh_case);
        cs_p->child = child_p;

        /* make the child the only case child */
        child_p->next = NULL;

        /* compile it normally */
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, (struct lysp_node *)cs_p, node, 0, child_set), revert_sh_case);

        if (((struct lysc_node_choice *)node)->cases) {
            /* find our case node */
            cs_c = (struct lysc_node_case *)((struct lysc_node_choice *)node)->cases;
            while (cs_c->name != cs_p->name) {
                cs_c = (struct lysc_node_case *)cs_c->next;
                assert(cs_c);
            }

            if (ctx->ctx->flags & LY_CTX_SET_PRIV_PARSED) {
                /* compiled case node cannot point to his corresponding parsed node
                 * because it exists temporarily so it must be set to NULL
                 */
                assert(cs_c->priv == cs_p);
                cs_c->priv = NULL;
            }

            /* status is copied from his child and not from his parent as usual. */
            if (cs_c->child) {
                cs_c->flags &= ~LYS_STATUS_MASK;
                cs_c->flags |= (LYS_STATUS_MASK & cs_c->child->flags);
            }
        } /* else it was removed by a deviation */

revert_sh_case:
        /* free the parsed shorthand case and correct pointers back */
        cs_p->child = NULL;
        lysp_node_free(&ctx->free_ctx, (struct lysp_node *)cs_p);
        child_p->next = child_p_next;
    }

    return ret;
}